

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::EmitAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapPromiseCapabilityInfo *capabilityInfo;
  
  if (snpObject->SnapObjectTag == SnapPromiseAllSettledResolveOrRejectElementFunctionObject) {
    capabilityInfo = (SnapPromiseCapabilityInfo *)snpObject->AddtlSnapObjectInfo;
    (*writer->_vptr_FileWriter[3])(writer,3,1);
    NSSnapValues::EmitPromiseCapabilityInfo(capabilityInfo,writer,NoSeparator);
    FileWriter::WriteUInt32(writer,u32Val,(uint32)capabilityInfo[1].CapabilityId,CommaSeparator);
    FileWriter::WriteAddr(writer,ptrIdVal,(TTD_PTR_ID)capabilityInfo[1].PromiseVar,CommaSeparator);
    FileWriter::WriteUInt32(writer,u32Val,*(uint32 *)&capabilityInfo[1].ResolveVar,CommaSeparator);
    FileWriter::WriteAddr(writer,ptrIdVal,(TTD_PTR_ID)capabilityInfo[1].RejectVar,CommaSeparator);
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(byte)capabilityInfo[2].CapabilityId,1);
    (*writer->_vptr_FileWriter[0xc])
              (writer,10,(ulong)*(byte *)((long)&capabilityInfo[2].CapabilityId + 1),1);
    FileWriter::WriteAddr(writer,ptrIdVal,(TTD_PTR_ID)capabilityInfo[2].PromiseVar,CommaSeparator);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void EmitAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject);

            writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitPromiseCapabilityInfo(&aInfo->Capabilities, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt32(NSTokens::Key::u32Val, aInfo->Index, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->RemainingElementsWrapperId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, aInfo->RemainingElementsValue, NSTokens::Separator::CommaSeparator);

            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->AlreadyCalledWrapperId, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, aInfo->AlreadyCalledValue, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, aInfo->IsRejecting, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->Values, NSTokens::Separator::CommaSeparator);
        }